

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

node<NULLC::Range> * __thiscall
TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate
          (TypedObjectPool<detail::node<NULLC::Range>,_1024> *this)

{
  MyLargeBlock *pMVar1;
  ulong uVar2;
  MySmallBlock *pMVar3;
  
  pMVar3 = this->freeBlocks;
  if (pMVar3 == (MySmallBlock *)0x0) {
    uVar2 = (ulong)this->lastNum;
    if (this->lastNum == 0x400) {
      pMVar1 = (MyLargeBlock *)(*(code *)NULLC::alloc)(0xa008);
      pMVar1->next = this->activePages;
      this->activePages = pMVar1;
      uVar2 = 0;
    }
    else {
      pMVar1 = this->activePages;
    }
    this->lastNum = (int)uVar2 + 1;
    pMVar3 = pMVar1->page + uVar2;
  }
  else {
    this->freeBlocks = pMVar3->next;
  }
  *(node<NULLC::Range> **)(pMVar3->data + 0x10) = (node<NULLC::Range> *)0x0;
  *(node<NULLC::Range> **)(pMVar3->data + 0x18) = (node<NULLC::Range> *)0x0;
  pMVar3->next = (SmallBlock<detail::node<NULLC::Range>_> *)0x0;
  *(void **)((long)pMVar3 + 8) = (void *)0x0;
  *(int *)(pMVar3->data + 0x20) = 1;
  return (node<NULLC::Range> *)pMVar3;
}

Assistant:

T* Allocate()
	{
		MySmallBlock *result;
		if(freeBlocks)
		{
			result = freeBlocks;
			freeBlocks = freeBlocks->next;
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock *newPage = new(NULLC::alloc(sizeof(MyLargeBlock))) MyLargeBlock;
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
			}
			result = &activePages->page[lastNum++];
		}
		return new(result) T;
	}